

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsharedmemory_p.h
# Opt level: O0

bool __thiscall
QSharedMemoryPrivate::tryLocker
          (QSharedMemoryPrivate *this,QSharedMemoryLocker *locker,QString *function)

{
  bool bVar1;
  undefined8 in_RDX;
  int fieldWidth;
  QString *in_RDI;
  long in_FS_OFFSET;
  undefined4 in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff77;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 uVar2;
  QString *pQVar3;
  QChar fillChar;
  QChar local_3a;
  char local_38 [48];
  long local_8;
  
  fieldWidth = (int)((ulong)in_RDX >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = in_RDI;
  bVar1 = QSharedMemoryLocker::lock
                    ((QSharedMemoryLocker *)
                     CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  fillChar.ucs = (char16_t)((ulong)pQVar3 >> 0x30);
  if (!bVar1) {
    uVar2 = 0;
    QSharedMemory::tr(local_38,(char *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70)
                      ,in_stack_ffffffffffffff6c);
    QChar::QChar<char16_t,_true>(&local_3a,L' ');
    QString::arg<QString,_true>
              (in_RDI,(QString *)CONCAT44(uVar2,in_stack_ffffffffffffff88),fieldWidth,fillChar);
    QString::operator=((QString *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
                       (QString *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    QString::~QString((QString *)0x262703);
    QString::~QString((QString *)0x26270d);
    *(undefined4 *)((long)&in_RDI[8].d.size + 4) = 6;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return bVar1;
}

Assistant:

bool tryLocker(QSharedMemoryLocker *locker, const QString &function) {
        if (!locker->lock()) {
            errorString = QSharedMemory::tr("%1: unable to lock").arg(function);
            error = QSharedMemory::LockError;
            return false;
        }
        return true;
    }